

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *this)

{
  SourceFile *pSVar1;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar2;
  SourceFile *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (SourceFile *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (SourceFile *)0x0;
    this->pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
    this->endPtr = (SourceFile *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x20,(long)pRVar2 - (long)pSVar1 >> 5,
               (long)pSVar3 - (long)pSVar1 >> 5,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }